

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiMenuColumns::CalcNextTotalWidth(ImGuiMenuColumns *this,bool update_offsets)

{
  ImU16 IVar1;
  bool bVar2;
  ImU16 width;
  int i;
  bool want_spacing;
  ImU16 offset;
  bool update_offsets_local;
  ImGuiMenuColumns *this_local;
  
  offset = 0;
  bVar2 = false;
  for (i = 0; i < 4; i = i + 1) {
    IVar1 = this->Widths[i];
    if ((bVar2) && (IVar1 != 0)) {
      offset = offset + this->Spacing;
    }
    bVar2 = bVar2 || IVar1 != 0;
    if (update_offsets) {
      if (i == 1) {
        this->OffsetLabel = offset;
      }
      if (i == 2) {
        this->OffsetShortcut = offset;
      }
      if (i == 3) {
        this->OffsetMark = offset;
      }
    }
    offset = offset + IVar1;
  }
  this->NextTotalWidth = (uint)offset;
  return;
}

Assistant:

void ImGuiMenuColumns::CalcNextTotalWidth(bool update_offsets)
{
    ImU16 offset = 0;
    bool want_spacing = false;
    for (int i = 0; i < IM_ARRAYSIZE(Widths); i++)
    {
        ImU16 width = Widths[i];
        if (want_spacing && width > 0)
            offset += Spacing;
        want_spacing |= (width > 0);
        if (update_offsets)
        {
            if (i == 1) { OffsetLabel = offset; }
            if (i == 2) { OffsetShortcut = offset; }
            if (i == 3) { OffsetMark = offset; }
        }
        offset += width;
    }
    NextTotalWidth = offset;
}